

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::ShaderStateQueryTests::init(ShaderStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  undefined4 uVar1;
  BaseTypeCase *pBVar2;
  undefined8 extraout_RAX;
  undefined8 uVar3;
  TestCase *this_00;
  undefined8 extraout_RAX_00;
  long lVar4;
  
  pBVar2 = (BaseTypeCase *)operator_new(0x80);
  anon_unknown_1::BaseTypeCase::BaseTypeCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"sampler_type","Sampler type cases",
             (char *)0x0);
  (pBVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4d328;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BaseTypeCase *)operator_new(0x80);
  anon_unknown_1::BaseTypeCase::BaseTypeCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"sampler_type_multisample_array",
             "MSAA array sampler type cases","GL_OES_texture_storage_multisample_2d_array");
  (pBVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4d438;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BaseTypeCase *)operator_new(0x80);
  anon_unknown_1::BaseTypeCase::BaseTypeCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"sampler_type_texture_buffer",
             "Texture buffer sampler type cases","GL_EXT_texture_buffer");
  (pBVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4d4e8;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BaseTypeCase *)operator_new(0x80);
  anon_unknown_1::BaseTypeCase::BaseTypeCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"image_type_texture_buffer",
             "Texture buffer image type cases","GL_EXT_texture_buffer");
  (pBVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4d598;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BaseTypeCase *)operator_new(0x80);
  anon_unknown_1::BaseTypeCase::BaseTypeCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"sampler_type_cube_array",
             "Cube array sampler type cases","GL_EXT_texture_cube_map_array");
  (pBVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4d648;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  pBVar2 = (BaseTypeCase *)operator_new(0x80);
  anon_unknown_1::BaseTypeCase::BaseTypeCase
            (pBVar2,(this->super_TestCaseGroup).m_context,"image_type_cube_array",
             "Cube array image type cases","GL_EXT_texture_cube_map_array");
  (pBVar2->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_01e4d710;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar2);
  uVar3 = extraout_RAX;
  for (lVar4 = 8; lVar4 != 0x68; lVar4 = lVar4 + 0x10) {
    this_00 = (TestCase *)operator_new(0x80);
    uVar1 = *(undefined4 *)((long)&init::shaderTypes[0].caseName + lVar4);
    gles31::TestCase::TestCase
              (this_00,(this->super_TestCaseGroup).m_context,*(char **)(&UNK_01e4d298 + lVar4),
               glcts::fixed_sample_locations_values + 1);
    (this_00->super_TestCase).super_TestNode._vptr_TestNode = (_func_int **)&PTR__TestCase_01e4d7b8;
    *(undefined4 *)&this_00[1].super_TestCase.super_TestNode._vptr_TestNode = uVar1;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    uVar3 = extraout_RAX_00;
  }
  return (int)uVar3;
}

Assistant:

void ShaderStateQueryTests::init (void)
{
	addChild(new CoreSamplerTypeCase			(m_context, "sampler_type",						"Sampler type cases"));
	addChild(new MSArraySamplerTypeCase			(m_context, "sampler_type_multisample_array",	"MSAA array sampler type cases"));
	addChild(new TextureBufferSamplerTypeCase	(m_context, "sampler_type_texture_buffer",		"Texture buffer sampler type cases"));
	addChild(new TextureBufferImageTypeCase		(m_context, "image_type_texture_buffer",		"Texture buffer image type cases"));
	addChild(new CubeArraySamplerTypeCase		(m_context, "sampler_type_cube_array",			"Cube array sampler type cases"));
	addChild(new CubeArrayImageTypeCase			(m_context, "image_type_cube_array",			"Cube array image type cases"));

	// shader info log tests
	// \note, there exists similar tests in gles3 module. However, the gles31 could use a different
	//        shader compiler with different INFO_LOG bugs.
	{
		static const struct
		{
			const char*		caseName;
			glu::ShaderType	caseType;
		} shaderTypes[] =
		{
			{ "info_log_vertex",		glu::SHADERTYPE_VERTEX					},
			{ "info_log_fragment",		glu::SHADERTYPE_FRAGMENT				},
			{ "info_log_geometry",		glu::SHADERTYPE_GEOMETRY				},
			{ "info_log_tess_ctrl",		glu::SHADERTYPE_TESSELLATION_CONTROL	},
			{ "info_log_tess_eval",		glu::SHADERTYPE_TESSELLATION_EVALUATION	},
			{ "info_log_compute",		glu::SHADERTYPE_COMPUTE					},
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(shaderTypes); ++ndx)
			addChild(new ShaderLogCase(m_context, shaderTypes[ndx].caseName, "", shaderTypes[ndx].caseType));
	}
}